

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Accuracy::InterpolationCase::InterpolationCase
          (InterpolationCase *this,Context *context,char *name,char *desc,Precision precision,
          Vec3 *minVal,Vec3 *maxVal,bool projective)

{
  bool projective_local;
  Vec3 *minVal_local;
  Precision precision_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  InterpolationCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,NODETYPE_ACCURACY,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterpolationCase_015917d8;
  this->m_precision = precision;
  tcu::Vector<float,_3>::Vector(&this->m_min,minVal);
  tcu::Vector<float,_3>::Vector(&this->m_max,maxVal);
  this->m_projective = projective;
  return;
}

Assistant:

InterpolationCase::InterpolationCase (Context& context, const char* name, const char* desc, glu::Precision precision, const tcu::Vec3& minVal, const tcu::Vec3& maxVal, bool projective)
	: TestCase		(context, tcu::NODETYPE_ACCURACY, name, desc)
	, m_precision	(precision)
	, m_min			(minVal)
	, m_max			(maxVal)
	, m_projective	(projective)
{
}